

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::iterate(FunctionalTest *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  undefined4 *puVar6;
  bool local_51;
  bool local_4f;
  bool local_4d;
  bool local_4b;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  FunctionalTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    this->m_pClearNamedBufferData = *(PFNGLCLEARNAMEDBUFFERDATA *)(lVar5 + 0x1d8);
    this->m_pClearNamedBufferSubData = *(PFNGLCLEARNAMEDBUFFERSUBDATA *)(lVar5 + 0x1e0);
    this->m_pCopyNamedBufferSubData = *(PFNGLCOPYNAMEDBUFFERSUBDATA *)(lVar5 + 0x340);
    this->m_pFlushMappedNamedBufferRange = *(PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE *)(lVar5 + 0x660);
    this->m_pGetNamedBufferParameteri64v = *(PFNGLGETNAMEDBUFFERPARAMETERI64V *)(lVar5 + 0x8f0);
    this->m_pGetNamedBufferParameteriv = *(PFNGLGETNAMEDBUFFERPARAMETERIV *)(lVar5 + 0x8f8);
    this->m_pGetNamedBufferPointerv = *(PFNGLGETNAMEDBUFFERPOINTERV *)(lVar5 + 0x900);
    this->m_pGetNamedBufferSubData = *(PFNGLGETNAMEDBUFFERSUBDATA *)(lVar5 + 0x908);
    this->m_pMapNamedBuffer = *(PFNGLMAPNAMEDBUFFER *)(lVar5 + 0xd08);
    this->m_pMapNamedBufferRange = *(PFNGLMAPNAMEDBUFFERRANGE *)(lVar5 + 0xd10);
    this->m_pNamedBufferData = *(PFNGLNAMEDBUFFERDATA *)(lVar5 + 0xec0);
    this->m_pNamedBufferStorage = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar5 + 0xed8);
    this->m_pNamedBufferSubData = *(PFNGLNAMEDBUFFERSUBDATA *)(lVar5 + 0xee0);
    this->m_pUnmapNamedBuffer = *(PFNGLUNMAPNAMEDBUFFER *)(lVar5 + 0x1678);
    if (((this->m_pClearNamedBufferData == (PFNGLCLEARNAMEDBUFFERDATA)0x0) ||
        (((this->m_pClearNamedBufferSubData == (PFNGLCLEARNAMEDBUFFERSUBDATA)0x0 ||
          (this->m_pCopyNamedBufferSubData == (PFNGLCOPYNAMEDBUFFERSUBDATA)0x0)) ||
         (this->m_pFlushMappedNamedBufferRange == (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)0x0)))) ||
       ((((this->m_pGetNamedBufferParameteri64v == (PFNGLGETNAMEDBUFFERPARAMETERI64V)0x0 ||
          (this->m_pGetNamedBufferParameteriv == (PFNGLGETNAMEDBUFFERPARAMETERIV)0x0)) ||
         (this->m_pGetNamedBufferPointerv == (PFNGLGETNAMEDBUFFERPOINTERV)0x0)) ||
        (((this->m_pGetNamedBufferSubData == (PFNGLGETNAMEDBUFFERSUBDATA)0x0 ||
          (this->m_pMapNamedBuffer == (PFNGLMAPNAMEDBUFFER)0x0)) ||
         (((this->m_pMapNamedBufferRange == (PFNGLMAPNAMEDBUFFERRANGE)0x0 ||
           (((this->m_pNamedBufferData == (PFNGLNAMEDBUFFERDATA)0x0 ||
             (this->m_pNamedBufferStorage == (PFNGLNAMEDBUFFERSTORAGE)0x0)) ||
            (this->m_pNamedBufferSubData == (PFNGLNAMEDBUFFERSUBDATA)0x0)))) ||
          (this->m_pUnmapNamedBuffer == (PFNGLUNMAPNAMEDBUFFER)0x0)))))))) {
      puVar6 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar6 = 0;
      __cxa_throw(puVar6,&int::typeinfo,0);
    }
    BuildProgram(this);
    PrepareVertexArrayObject(this);
    bVar1 = PrepareInputBuffer(this);
    local_4b = false;
    if (bVar1) {
      local_4b = PrepareOutputBuffer(this);
    }
    if (local_4b != false) {
      Draw(this);
    }
    local_4d = false;
    if (local_4b != false) {
      local_4d = CheckArrayBufferImmutableFlag(this);
    }
    local_4f = false;
    if (local_4d != false) {
      local_4f = CheckTransformFeedbackBufferSize(this);
    }
    local_51 = false;
    if (local_4f != false) {
      local_51 = CheckTransformFeedbackResult(this);
    }
    Cleanup(this);
    do {
      iVar3 = (**(code **)(lVar5 + 0x800))();
    } while (iVar3 != 0);
    if (local_51 == false) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* API function pointers setup. */
	m_pClearNamedBufferData		   = (PFNGLCLEARNAMEDBUFFERDATA)gl.clearNamedBufferData;
	m_pClearNamedBufferSubData	 = (PFNGLCLEARNAMEDBUFFERSUBDATA)gl.clearNamedBufferSubData;
	m_pCopyNamedBufferSubData	  = (PFNGLCOPYNAMEDBUFFERSUBDATA)gl.copyNamedBufferSubData;
	m_pFlushMappedNamedBufferRange = (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)gl.flushMappedNamedBufferRange;
	m_pGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64V)gl.getNamedBufferParameteri64v;
	m_pGetNamedBufferParameteriv   = (PFNGLGETNAMEDBUFFERPARAMETERIV)gl.getNamedBufferParameteriv;
	m_pGetNamedBufferPointerv	  = (PFNGLGETNAMEDBUFFERPOINTERV)gl.getNamedBufferPointerv;
	m_pGetNamedBufferSubData	   = (PFNGLGETNAMEDBUFFERSUBDATA)gl.getNamedBufferSubData;
	m_pMapNamedBuffer			   = (PFNGLMAPNAMEDBUFFER)gl.mapNamedBuffer;
	m_pMapNamedBufferRange		   = (PFNGLMAPNAMEDBUFFERRANGE)gl.mapNamedBufferRange;
	m_pNamedBufferData			   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pNamedBufferStorage		   = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pNamedBufferSubData		   = (PFNGLNAMEDBUFFERSUBDATA)gl.namedBufferSubData;
	m_pUnmapNamedBuffer			   = (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;

	try
	{
		/* API function pointers check. */
		if ((DE_NULL == m_pClearNamedBufferData) || (DE_NULL == m_pClearNamedBufferSubData) ||
			(DE_NULL == m_pCopyNamedBufferSubData) || (DE_NULL == m_pFlushMappedNamedBufferRange) ||
			(DE_NULL == m_pGetNamedBufferParameteri64v) || (DE_NULL == m_pGetNamedBufferParameteriv) ||
			(DE_NULL == m_pGetNamedBufferPointerv) || (DE_NULL == m_pGetNamedBufferSubData) ||
			(DE_NULL == m_pMapNamedBuffer) || (DE_NULL == m_pMapNamedBufferRange) || (DE_NULL == m_pNamedBufferData) ||
			(DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pNamedBufferSubData) ||
			(DE_NULL == m_pUnmapNamedBuffer))
		{
			throw 0;
		}

		/* Running test. */
		BuildProgram();
		PrepareVertexArrayObject();

		is_ok = is_ok && PrepareInputBuffer();
		is_ok = is_ok && PrepareOutputBuffer();

		if (is_ok)
		{
			Draw();
		}

		is_ok = is_ok && CheckArrayBufferImmutableFlag();
		is_ok = is_ok && CheckTransformFeedbackBufferSize();
		is_ok = is_ok && CheckTransformFeedbackResult();
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean Up. */
	Cleanup();

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}